

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O1

string * __thiscall
XPMP2::GetMiscNetwTimeStr_abi_cxx11_(string *__return_storage_ptr__,XPMP2 *this,float _time)

{
  size_t sVar1;
  float fVar2;
  char aszTimeStr [20];
  char acStack_28 [24];
  
  if (NAN(_time)) {
    _time = GetMiscNetwTime();
  }
  fVar2 = _time - (float)((long)(_time / 3600.0) & 0xffffffff) * 3600.0;
  snprintf(acStack_28,0x14,"%u:%02u:%06.3f",
           (double)(fVar2 - (float)((long)(fVar2 / 60.0) & 0xffffffff) * 60.0));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_28);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_28,acStack_28 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string GetMiscNetwTimeStr (float _time)
{
    char aszTimeStr[20];
    if (std::isnan(_time))
        _time = GetMiscNetwTime();
    
    const unsigned runH = unsigned(_time / 3600.0f);
    _time -= runH * 3600.0f;
    const unsigned runM = unsigned(_time / 60.0f);
    _time -= runM * 60.0f;
    
    snprintf(aszTimeStr, sizeof(aszTimeStr), "%u:%02u:%06.3f",
             runH, runM, _time);
    return aszTimeStr;
}